

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFileTests.cc
# Opt level: O0

ValidSchema makeValidSchema(char *schema)

{
  shared_count extraout_RDX;
  element_type *in_RDI;
  ValidSchema VVar1;
  ValidSchema vs;
  istringstream iss;
  element_type *this;
  ValidSchema local_1d8;
  allocator<char> *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  istringstream local_190 [400];
  
  this = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::__cxx11::istringstream::istringstream(local_190,(string *)&stack0xfffffffffffffe50,_S_in);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe50);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe4f);
  avro::ValidSchema::ValidSchema(&local_1d8);
  avro::compileJsonSchema((istream *)local_190,&local_1d8);
  avro::ValidSchema::ValidSchema((ValidSchema *)this,(ValidSchema *)in_RDI);
  avro::ValidSchema::~ValidSchema((ValidSchema *)0x230194);
  std::__cxx11::istringstream::~istringstream(local_190);
  VVar1.root_.pn.pi_ = extraout_RDX.pi_;
  VVar1.root_.px = this;
  return (ValidSchema)VVar1.root_;
}

Assistant:

static ValidSchema makeValidSchema(const char* schema)
{
    istringstream iss(schema);
    ValidSchema vs;
    compileJsonSchema(iss, vs);
    return ValidSchema(vs);
}